

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O0

rfc5444_result
schedule_msgaddr_consumer
          (rfc5444_reader_tlvblock_consumer *consumer,rfc5444_reader_tlvblock_context *tlv_context,
          list_entity *addr_head)

{
  _Bool _Var1;
  rfc5444_result rVar2;
  list_entity *__tempptr_2;
  rfc5444_result r;
  uint8_t plen;
  uint8_t i;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  list_entity *plStack_30;
  rfc5444_result result;
  rfc5444_reader_addrblock_entry *addr;
  list_entity *addr_head_local;
  rfc5444_reader_tlvblock_context *tlv_context_local;
  rfc5444_reader_tlvblock_consumer *consumer_local;
  
  __tempptr._4_4_ = RFC5444_OKAY;
  tlv_context->type = RFC5444_CONTEXT_ADDRESS;
  plStack_30 = addr_head->next;
  do {
    if (plStack_30->prev == addr_head->prev) {
      tlv_context->addr_block_buffer = (uint8_t *)0x0;
      return __tempptr._4_4_;
    }
    tlv_context->addr_block_buffer = (uint8_t *)plStack_30[6].prev;
    tlv_context->addr_block_size = (size_t)plStack_30[7].next;
    tlv_context->addr_tlv_size = (size_t)plStack_30[7].prev;
    for (__tempptr_2._7_1_ = 0; __tempptr_2._7_1_ < *(byte *)&plStack_30[3].prev;
        __tempptr_2._7_1_ = __tempptr_2._7_1_ + 1) {
      _Var1 = bitmap256_get((bitmap256 *)(plStack_30 + 8),__tempptr_2._7_1_);
      if (!_Var1) {
        memcpy((void *)((long)&plStack_30[5].next + (ulong)*(byte *)((long)&plStack_30[3].prev + 1))
               ,(void *)((long)&(plStack_30[4].prev)->next +
                        (long)(int)((uint)*(byte *)((long)&plStack_30[3].prev + 2) *
                                   (uint)__tempptr_2._7_1_)),
               (ulong)*(byte *)((long)&plStack_30[3].prev + 2));
        if (plStack_30[4].next == (list_entity *)0x0) {
          __tempptr_2._6_1_ = *(undefined1 *)&plStack_30[6].next;
        }
        else {
          __tempptr_2._6_1_ =
               *(undefined1 *)((long)&(plStack_30[4].next)->next + (ulong)__tempptr_2._7_1_);
        }
        netaddr_from_binary_prefix
                  (&tlv_context->addr,plStack_30 + 5,tlv_context->addr_len,0,__tempptr_2._6_1_);
        tlv_context->addr_index = __tempptr_2._7_1_;
        if (consumer->start_callback !=
            (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) {
          tlv_context->consumer = consumer;
          __tempptr._4_4_ = (*consumer->start_callback)(tlv_context);
        }
        if (__tempptr._4_4_ == RFC5444_OKAY) {
          __tempptr._4_4_ =
               _schedule_tlvblock(consumer,tlv_context,(avl_tree *)(plStack_30 + 1),
                                  __tempptr_2._7_1_);
        }
        if (consumer->end_callback !=
            (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) {
          tlv_context->consumer = consumer;
          rVar2 = (*consumer->end_callback)(tlv_context,__tempptr._4_4_ != RFC5444_OKAY);
          if (__tempptr._4_4_ < rVar2) {
            __tempptr._4_4_ = rVar2;
          }
        }
        if (__tempptr._4_4_ == RFC5444_DROP_ADDRESS) {
          bitmap256_set((bitmap256 *)(plStack_30 + 8),__tempptr_2._7_1_);
          __tempptr._4_4_ = RFC5444_OKAY;
        }
        else if (__tempptr._4_4_ != RFC5444_OKAY) {
          return __tempptr._4_4_;
        }
      }
    }
    plStack_30 = plStack_30->next;
  } while( true );
}

Assistant:

static enum rfc5444_result
schedule_msgaddr_consumer(struct rfc5444_reader_tlvblock_consumer *consumer,
  struct rfc5444_reader_tlvblock_context *tlv_context, struct list_entity *addr_head) {
  struct rfc5444_reader_addrblock_entry *addr;
  enum rfc5444_result result = RFC5444_OKAY;

  tlv_context->type = RFC5444_CONTEXT_ADDRESS;

  /* consume address tlv block(s) */
  /* iterate over all address blocks */
  list_for_each_element(addr_head, addr, list_node) {
    uint8_t i, plen;

    /* initialize byte context */
    tlv_context->addr_block_buffer = addr->addr_block_ptr;
    tlv_context->addr_block_size = addr->addr_block_size;
    tlv_context->addr_tlv_size = addr->addr_tlv_size;

    /* iterate over all addresses in block */
    for (i = 0; i < addr->num_addr; i++) {
      /* test if we should skip this address */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (bitmap256_get(&addr->dropAddr, i)) {
        continue;
      }
#endif

      /* assemble address for context */
      memcpy(&addr->addr[addr->mid_start], &addr->mid_src[addr->mid_len * i], addr->mid_len);

      /* create netaddr */
      if (addr->prefixes) {
        plen = addr->prefixes[i];
      }
      else {
        plen = addr->prefixlen;
      }
      netaddr_from_binary_prefix(&tlv_context->addr, addr->addr, tlv_context->addr_len, 0, plen);

      /* remember index of address */
      tlv_context->addr_index = i;

      /* call start-of-context callback */
      if (consumer->start_callback) {
        /* can drop address, addressblock, message and packet */
        tlv_context->consumer = consumer;
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
        result =
#endif
          consumer->start_callback(tlv_context);
      }

      /* handle tlvblock callbacks */
      if (RFC5444_CONSUMER_DROP_ONLY(result == RFC5444_OKAY, true)) {
        result = _schedule_tlvblock(consumer, tlv_context, &addr->tlvblock, i);
      }

      /* call end-of-context callback */
      if (consumer->end_callback) {
        enum rfc5444_result r;
        tlv_context->consumer = consumer;
        r = consumer->end_callback(tlv_context, result != RFC5444_OKAY);
        if (r > result) {
          result = r;
        }
      }

#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      /* handle result from tlvblock callbacks */
      if (result == RFC5444_DROP_ADDRESS) {
        bitmap256_set(&addr->dropAddr, i);
        result = RFC5444_OKAY;
      }
      else if (result != RFC5444_OKAY) {
        return result;
      }
#endif
    }
  }

  /* remove context pointer */
  tlv_context->addr_block_buffer = NULL;

  return result;
}